

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O0

void borg_note_internal(_Bool warning,char *what)

{
  term *t;
  char *pcVar1;
  size_t sVar2;
  ushort **ppuVar3;
  long lVar4;
  char local_448 [8];
  char buf [1024];
  term_conflict2 *old;
  wchar_t y;
  wchar_t x;
  wchar_t h;
  wchar_t w;
  wchar_t k;
  wchar_t i;
  wchar_t n;
  wchar_t j;
  char *what_local;
  _Bool warning_local;
  
  t = Term;
  _n = what;
  what_local._7_1_ = warning;
  if (warning) {
    msg("%s",what);
  }
  else {
    message_add(what,0);
  }
  borg_info(_n);
  pcVar1 = strstr(_n,"Best Combo");
  if ((pcVar1 != (char *)0x0) || (pcVar1 = strstr(_n,"Taking off "), pcVar1 != (char *)0x0)) {
    borg.time_this_panel = borg.time_this_panel + 10;
    pcVar1 = format("# Anti-loop variable tick (%d).",(ulong)(uint)(int)borg.time_this_panel);
    borg_note(pcVar1);
  }
  for (i = L'\0'; i < L'\b'; i = i + L'\x01') {
    if ((angband_term[i] != (term *)0x0) && ((window_flag[i] & 0x4000) != 0)) {
      Term_activate(angband_term[i]);
      Term_get_size(&x,&y);
      Term_locate((int *)((long)&old + 4),(int *)&old);
      Term_erase(L'\0',(wchar_t)old,L'ÿ');
      sVar2 = strlen(_n);
      k = (wchar_t)sVar2;
      if (x + L'\xfffffffe' < k) {
        for (; x + L'\xfffffffe' < k; k = k - h) {
          h = x + L'\xfffffffe';
          for (w = x / 2; w < x + L'\xfffffffe'; w = w + L'\x01') {
            ppuVar3 = __ctype_b_loc();
            if (((*ppuVar3)[(int)_n[w]] & 0x2000) != 0) {
              h = w;
            }
          }
          for (w = L'\0'; w < h; w = w + L'\x01') {
            local_448[w] = _n[w];
          }
          lVar4 = (long)w;
          w = w + L'\x01';
          local_448[lVar4] = '\\';
          local_448[w] = '\0';
          Term_addstr(L'\xffffffff',L'\x01',local_448);
          old._0_4_ = (wchar_t)old + L'\x01';
          if (y <= (wchar_t)old) {
            old._0_4_ = L'\0';
          }
          Term_erase(L'\0',(wchar_t)old,L'ÿ');
          _n = _n + h;
        }
        Term_addstr(L'\xffffffff',L'\x01',_n);
        old._0_4_ = (wchar_t)old + L'\x01';
        if (y <= (wchar_t)old) {
          old._0_4_ = L'\0';
        }
        Term_erase(L'\0',(wchar_t)old,L'ÿ');
      }
      else {
        Term_addstr(L'\xffffffff',L'\x01',_n);
        old._0_4_ = (wchar_t)old + L'\x01';
        if (y <= (wchar_t)old) {
          old._0_4_ = L'\0';
        }
        Term_erase(L'\0',(wchar_t)old,L'ÿ');
      }
      Term_fresh();
      Term_activate(t);
    }
  }
  return;
}

Assistant:

static void borg_note_internal(bool warning, const char *what)
{
    int j, n, i, k;

    int w, h, x, y;

    term *old = Term;

    /* Memorize it */
    if (warning) {
        msg("%s", what);
    } else {
        message_add(what, MSG_GENERIC);
    }

    /* Log the message */
    borg_info(what);

    /* Mega-Hack -- Check against the swap loops */
    if (strstr(what, "Best Combo") || strstr(what, "Taking off ")) {
        /* Tick the anti loop clock */
        borg.time_this_panel += 10;
        borg_note(
            format("# Anti-loop variable tick (%d).", borg.time_this_panel));
    }

    /* Scan windows */
    for (j = 0; j < 8; j++) {
        if (!angband_term[j])
            continue;

        /* Check flag */
        if (!(window_flag[j] & PW_BORG_1))
            continue;

        /* Activate */
        Term_activate(angband_term[j]);

        /* Access size */
        Term_get_size(&w, &h);

        /* Access cursor */
        Term_locate(&x, &y);

        /* Erase current line */
        Term_erase(0, y, 255);

        /* Total length */
        n = strlen(what);

        /* Too long */
        if (n > w - 2) {
            char buf[1024];

            /* Split */
            while (n > w - 2) {
                /* Default */
                k = w - 2;

                /* Find a split point */
                for (i = w / 2; i < w - 2; i++) {
                    /* Pre-emptive split point */
                    if (isspace(what[i]))
                        k = i;
                }

                /* Copy over the split message */
                for (i = 0; i < k; i++) {
                    /* Copy */
                    buf[i] = what[i];
                }

                /* Indicate split */
                buf[i++] = '\\';

                /* Terminate */
                buf[i] = '\0';

                /* Show message */
                Term_addstr(-1, COLOUR_WHITE, buf);

                /* Advance (wrap) */
                if (++y >= h)
                    y = 0;

                /* Erase next line */
                Term_erase(0, y, 255);

                /* Advance */
                what += k;

                /* Reduce */
                n -= k;
            }

            /* Show message tail */
            Term_addstr(-1, COLOUR_WHITE, what);

            /* Advance (wrap) */
            if (++y >= h)
                y = 0;

            /* Erase next line */
            Term_erase(0, y, 255);
        }

        /* Normal */
        else {
            /* Show message */
            Term_addstr(-1, COLOUR_WHITE, what);

            /* Advance (wrap) */
            if (++y >= h)
                y = 0;

            /* Erase next line */
            Term_erase(0, y, 255);
        }

        /* Flush output */
        Term_fresh();

        /* Use correct window */
        Term_activate(old);
    }
}